

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTcpSocket_*>::reallocateAndGrow
          (QArrayDataPointer<QTcpSocket_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTcpSocket_*> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QTcpSocket_*> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QTcpSocket_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTcpSocket_*> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QTcpSocket_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QTcpSocket_*> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTcpSocket_*> *)0xaaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QTcpSocket_*> *)
                  operator->((QArrayDataPointer<QTcpSocket_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTcpSocket_*> *)0x264d5c);
        begin((QArrayDataPointer<QTcpSocket_*> *)0x264d6b);
        QtPrivate::QPodArrayOps<QTcpSocket_*>::copyAppend
                  (this_00,(QTcpSocket **)in_stack_ffffffffffffff88,
                   (QTcpSocket **)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QTcpSocket_*> *)
             operator->((QArrayDataPointer<QTcpSocket_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTcpSocket_*> *)0x264da4);
        begin((QArrayDataPointer<QTcpSocket_*> *)0x264db3);
        QtPrivate::QPodArrayOps<QTcpSocket_*>::moveAppend
                  ((QPodArrayOps<QTcpSocket_*> *)in_stack_ffffffffffffff80,
                   (QTcpSocket **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (QTcpSocket **)0x264dd1);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QTcpSocket_*> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QTcpSocket_*> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QTcpSocket_*>::reallocate
              ((QPodArrayOps<QTcpSocket_*> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }